

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O3

ArchType __thiscall llvm::Triple::getArchTypeForLLVMName(Triple *this,StringRef Name)

{
  ArchType AVar1;
  StringRef ArchName;
  
  ArchName.Length = Name.Data;
  ArchName.Data = (char *)this;
  AVar1 = parseBPFArch(ArchName);
  switch(ArchName.Length + -3) {
  case (char *)0x0:
    if (*(char *)((long)&(this->Data)._M_dataplus._M_p + 2) == 'c' &&
        *(short *)&(this->Data)._M_dataplus._M_p == 0x7261) {
      return arc;
    }
    if (*(char *)((long)&(this->Data)._M_dataplus._M_p + 2) == 'm' &&
        *(short *)&(this->Data)._M_dataplus._M_p == 0x7261) {
      return arm;
    }
    if (*(char *)((long)&(this->Data)._M_dataplus._M_p + 2) == 'r' &&
        *(short *)&(this->Data)._M_dataplus._M_p == 0x7661) {
      return avr;
    }
    if (*(char *)((long)&(this->Data)._M_dataplus._M_p + 2) == 'f' &&
        *(short *)&(this->Data)._M_dataplus._M_p == 0x7062) {
      return AVar1;
    }
    goto switchD_0012e865_caseD_0;
  default:
    if (ArchName.Length < (char *)0x3) {
      return UnknownArch;
    }
    break;
  case (char *)0x2:
    if (*(char *)((long)&(this->Data)._M_dataplus._M_p + 4) == '4' &&
        *(int *)&(this->Data)._M_dataplus._M_p == 0x366d7261) {
      return aarch64;
    }
    if (*(char *)((long)&(this->Data)._M_dataplus._M_p + 4) == 'b' &&
        *(int *)&(this->Data)._M_dataplus._M_p == 0x656d7261) {
      return armeb;
    }
    break;
  case (char *)0x4:
    if (*(int *)((long)&(this->Data)._M_dataplus._M_p + 3) == 0x34366863 &&
        *(int *)&(this->Data)._M_dataplus._M_p == 0x63726161) {
      return aarch64;
    }
    break;
  case (char *)0x7:
    if ((short)(this->Data)._M_string_length == 0x6562 &&
        (this->Data)._M_dataplus._M_p == (pointer)0x5f34366863726161) {
      return aarch64_be;
    }
  }
  if (*(char *)((long)&(this->Data)._M_dataplus._M_p + 2) == 'f' &&
      *(short *)&(this->Data)._M_dataplus._M_p == 0x7062) {
    return AVar1;
  }
  switch(ArchName.Length + -3) {
  case (char *)0x0:
switchD_0012e865_caseD_0:
    if (*(char *)((long)&(this->Data)._M_dataplus._M_p + 2) == 'c' &&
        *(short *)&(this->Data)._M_dataplus._M_p == 0x7070) {
      return ppc;
    }
    if (*(char *)((long)&(this->Data)._M_dataplus._M_p + 2) == 'e' &&
        *(short *)&(this->Data)._M_dataplus._M_p == 0x6374) {
      return tce;
    }
    if (*(char *)((long)&(this->Data)._M_dataplus._M_p + 2) == '6' &&
        *(short *)&(this->Data)._M_dataplus._M_p == 0x3878) {
      return x86;
    }
    break;
  case (char *)0x1:
    if (*(int *)&(this->Data)._M_dataplus._M_p == 0x7370696d) {
      return mips;
    }
    if (*(int *)&(this->Data)._M_dataplus._M_p == 0x30303672) {
      return r600;
    }
    if (*(int *)&(this->Data)._M_dataplus._M_p == 0x3233656c) {
      return le32;
    }
    if (*(int *)&(this->Data)._M_dataplus._M_p == 0x3436656c) {
      return le64;
    }
    if (*(int *)&(this->Data)._M_dataplus._M_p == 0x72697073) {
      return spir;
    }
    break;
  case (char *)0x2:
    if (*(char *)((long)&(this->Data)._M_dataplus._M_p + 4) == '2' &&
        *(int *)&(this->Data)._M_dataplus._M_p == 0x736f696e) {
      return nios2;
    }
    if (*(char *)((long)&(this->Data)._M_dataplus._M_p + 4) == '4' &&
        *(int *)&(this->Data)._M_dataplus._M_p == 0x36637070) {
      return ppc64;
    }
    if (*(char *)((long)&(this->Data)._M_dataplus._M_p + 4) == '2' &&
        *(int *)&(this->Data)._M_dataplus._M_p == 0x33637070) {
      return ppc;
    }
    if (*(char *)((long)&(this->Data)._M_dataplus._M_p + 4) == 'c' &&
        *(int *)&(this->Data)._M_dataplus._M_p == 0x72617073) {
      return sparc;
    }
    if (*(char *)((long)&(this->Data)._M_dataplus._M_p + 4) == 'e' &&
        *(int *)&(this->Data)._M_dataplus._M_p == 0x6c656374) {
      return tcele;
    }
    if (*(char *)((long)&(this->Data)._M_dataplus._M_p + 4) == 'b' &&
        *(int *)&(this->Data)._M_dataplus._M_p == 0x6d756874) {
      return thumb;
    }
    if (*(char *)((long)&(this->Data)._M_dataplus._M_p + 4) == 'e' &&
        *(int *)&(this->Data)._M_dataplus._M_p == 0x726f6378) {
      return xcore;
    }
    if (*(char *)((long)&(this->Data)._M_dataplus._M_p + 4) == 'x' &&
        *(int *)&(this->Data)._M_dataplus._M_p == 0x7470766e) {
      return nvptx;
    }
    if (*(char *)((long)&(this->Data)._M_dataplus._M_p + 4) == 'l' &&
        *(int *)&(this->Data)._M_dataplus._M_p == 0x69646d61) {
      return amdil;
    }
    if (*(char *)((long)&(this->Data)._M_dataplus._M_p + 4) == 'l' &&
        *(int *)&(this->Data)._M_dataplus._M_p == 0x69617368) {
      return hsail;
    }
    if (*(char *)((long)&(this->Data)._M_dataplus._M_p + 4) == 'i' &&
        *(int *)&(this->Data)._M_dataplus._M_p == 0x616e616c) {
      return lanai;
    }
    if (*(char *)((long)&(this->Data)._M_dataplus._M_p + 4) == 'e' &&
        *(int *)&(this->Data)._M_dataplus._M_p == 0x76616873) {
      return shave;
    }
    break;
  case (char *)0x3:
    if (*(short *)((long)&(this->Data)._M_dataplus._M_p + 4) == 0x6c65 &&
        *(int *)&(this->Data)._M_dataplus._M_p == 0x7370696d) {
      return mipsel;
    }
    if (*(short *)((long)&(this->Data)._M_dataplus._M_p + 4) == 0x3436 &&
        *(int *)&(this->Data)._M_dataplus._M_p == 0x7370696d) {
      return mips64;
    }
    if (*(short *)((long)&(this->Data)._M_dataplus._M_p + 4) == 0x3033 &&
        *(int *)&(this->Data)._M_dataplus._M_p == 0x3470736d) {
      return msp430;
    }
    if (*(short *)((long)&(this->Data)._M_dataplus._M_p + 4) == 0x6e63 &&
        *(int *)&(this->Data)._M_dataplus._M_p == 0x67646d61) {
      return amdgcn;
    }
    if (*(short *)((long)&(this->Data)._M_dataplus._M_p + 4) == 0x3436 &&
        *(int *)&(this->Data)._M_dataplus._M_p == 0x2d363878) {
      return x86_64;
    }
    if (*(short *)((long)&(this->Data)._M_dataplus._M_p + 4) == 0x3436 &&
        *(int *)&(this->Data)._M_dataplus._M_p == 0x72697073) {
      return spir64;
    }
    if (*(short *)((long)&(this->Data)._M_dataplus._M_p + 4) == 0x3233 &&
        *(int *)&(this->Data)._M_dataplus._M_p == 0x6d736177) {
      return wasm32;
    }
    if (*(short *)((long)&(this->Data)._M_dataplus._M_p + 4) == 0x3436 &&
        *(int *)&(this->Data)._M_dataplus._M_p == 0x6d736177) {
      return wasm64;
    }
    break;
  case (char *)0x4:
    if (*(int *)((long)&(this->Data)._M_dataplus._M_p + 3) == 0x656c3436 &&
        *(int *)&(this->Data)._M_dataplus._M_p == 0x36637070) {
      return ppc64le;
    }
    if (*(int *)((long)&(this->Data)._M_dataplus._M_p + 3) == 0x32337663 &&
        *(int *)&(this->Data)._M_dataplus._M_p == 0x63736972) {
      return riscv32;
    }
    if (*(int *)((long)&(this->Data)._M_dataplus._M_p + 3) == 0x34367663 &&
        *(int *)&(this->Data)._M_dataplus._M_p == 0x63736972) {
      return riscv64;
    }
    if (*(int *)((long)&(this->Data)._M_dataplus._M_p + 3) == 0x6e6f6761 &&
        *(int *)&(this->Data)._M_dataplus._M_p == 0x61786568) {
      return hexagon;
    }
    if (*(int *)((long)&(this->Data)._M_dataplus._M_p + 3) == 0x6c656372 &&
        *(int *)&(this->Data)._M_dataplus._M_p == 0x72617073) {
      return sparcel;
    }
    if (*(int *)((long)&(this->Data)._M_dataplus._M_p + 3) == 0x39766372 &&
        *(int *)&(this->Data)._M_dataplus._M_p == 0x72617073) {
      return sparcv9;
    }
    if (*(int *)((long)&(this->Data)._M_dataplus._M_p + 3) == 0x7a6d6574 &&
        *(int *)&(this->Data)._M_dataplus._M_p == 0x74737973) {
      return systemz;
    }
    if (*(int *)((long)&(this->Data)._M_dataplus._M_p + 3) == 0x6265626d &&
        *(int *)&(this->Data)._M_dataplus._M_p == 0x6d756874) {
      return thumbeb;
    }
    if (*(int *)((long)&(this->Data)._M_dataplus._M_p + 3) == 0x34367874 &&
        *(int *)&(this->Data)._M_dataplus._M_p == 0x7470766e) {
      return nvptx64;
    }
    if (*(int *)((long)&(this->Data)._M_dataplus._M_p + 3) == 0x34366c69 &&
        *(int *)&(this->Data)._M_dataplus._M_p == 0x69646d61) {
      return amdil64;
    }
    if (*(int *)((long)&(this->Data)._M_dataplus._M_p + 3) == 0x34366c69 &&
        *(int *)&(this->Data)._M_dataplus._M_p == 0x69617368) {
      return hsail64;
    }
    if (*(int *)((long)&(this->Data)._M_dataplus._M_p + 3) == 0x61626d69 &&
        *(int *)&(this->Data)._M_dataplus._M_p == 0x696c616b) {
      return kalimba;
    }
    break;
  case (char *)0x5:
    if ((this->Data)._M_dataplus._M_p == (pointer)0x6c6534367370696d) {
      return mips64el;
    }
    break;
  case (char *)0xb:
    if (*(long *)((long)&(this->Data)._M_dataplus._M_p + 6) == 0x3233747069726373 &&
        (this->Data)._M_dataplus._M_p == (pointer)0x63737265646e6572) {
      return renderscript32;
    }
    if (*(long *)((long)&(this->Data)._M_dataplus._M_p + 6) != 0x3436747069726373 ||
        (this->Data)._M_dataplus._M_p != (pointer)0x63737265646e6572) {
      return UnknownArch;
    }
    return LastArchType;
  }
  return UnknownArch;
}

Assistant:

Triple::ArchType Triple::getArchTypeForLLVMName(StringRef Name) {
  Triple::ArchType BPFArch(parseBPFArch(Name));
  return StringSwitch<Triple::ArchType>(Name)
    .Case("aarch64", aarch64)
    .Case("aarch64_be", aarch64_be)
    .Case("arc", arc)
    .Case("arm64", aarch64) // "arm64" is an alias for "aarch64"
    .Case("arm", arm)
    .Case("armeb", armeb)
    .Case("avr", avr)
    .StartsWith("bpf", BPFArch)
    .Case("mips", mips)
    .Case("mipsel", mipsel)
    .Case("mips64", mips64)
    .Case("mips64el", mips64el)
    .Case("msp430", msp430)
    .Case("nios2", nios2)
    .Case("ppc64", ppc64)
    .Case("ppc32", ppc)
    .Case("ppc", ppc)
    .Case("ppc64le", ppc64le)
    .Case("r600", r600)
    .Case("amdgcn", amdgcn)
    .Case("riscv32", riscv32)
    .Case("riscv64", riscv64)
    .Case("hexagon", hexagon)
    .Case("sparc", sparc)
    .Case("sparcel", sparcel)
    .Case("sparcv9", sparcv9)
    .Case("systemz", systemz)
    .Case("tce", tce)
    .Case("tcele", tcele)
    .Case("thumb", thumb)
    .Case("thumbeb", thumbeb)
    .Case("x86", x86)
    .Case("x86-64", x86_64)
    .Case("xcore", xcore)
    .Case("nvptx", nvptx)
    .Case("nvptx64", nvptx64)
    .Case("le32", le32)
    .Case("le64", le64)
    .Case("amdil", amdil)
    .Case("amdil64", amdil64)
    .Case("hsail", hsail)
    .Case("hsail64", hsail64)
    .Case("spir", spir)
    .Case("spir64", spir64)
    .Case("kalimba", kalimba)
    .Case("lanai", lanai)
    .Case("shave", shave)
    .Case("wasm32", wasm32)
    .Case("wasm64", wasm64)
    .Case("renderscript32", renderscript32)
    .Case("renderscript64", renderscript64)
    .Default(UnknownArch);
}